

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void clear_vec_high(DisasContext_conflict1 *s,_Bool is_q,int rd)

{
  uintptr_t o;
  TCGv_i64 pTVar1;
  int in_ECX;
  uint32_t oprsz;
  undefined7 in_register_00000031;
  TCGContext_conflict1 *tcg_ctx;
  
  tcg_ctx = (TCGContext_conflict1 *)CONCAT71(in_register_00000031,is_q);
  if (rd == 0) {
    pTVar1 = tcg_const_i64_aarch64(tcg_ctx,0);
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i64,(TCGArg)(pTVar1 + (long)tcg_ctx),
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(in_ECX * 0x100 + 0xc18));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  }
  if (0x10 < (uint)s) {
    oprsz = (uint)s - 0x10;
    tcg_gen_gvec_dup8i_aarch64(tcg_ctx,in_ECX * 0x100 + 0xc20,oprsz,oprsz,'\0');
    return;
  }
  return;
}

Assistant:

static void clear_vec_high(DisasContext *s, bool is_q, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned ofs = fp_reg_offset(s, rd, MO_64);
    unsigned vsz = vec_full_reg_size(s);

    if (!is_q) {
        TCGv_i64 tcg_zero = tcg_const_i64(tcg_ctx, 0);
        tcg_gen_st_i64(tcg_ctx, tcg_zero, tcg_ctx->cpu_env, ofs + 8);
        tcg_temp_free_i64(tcg_ctx, tcg_zero);
    }
    if (vsz > 16) {
        tcg_gen_gvec_dup8i(tcg_ctx, ofs + 16, vsz - 16, vsz - 16, 0);
    }
}